

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_zip_32(c_v256 *__return_storage_ptr__,c_v128 a,c_v128 b)

{
  __return_storage_ptr__->u64[2] = a.u64[1] << 0x20 | b.u64[1] & 0xffffffff;
  __return_storage_ptr__->u64[3] = a.u64[1] & 0xffffffff00000000 | b.u64[1] >> 0x20;
  __return_storage_ptr__->u64[0] = a.u64[0] << 0x20 | (ulong)b.u32[0];
  __return_storage_ptr__->u64[1] = a.u64[0] & 0xffffffff00000000 | b.u64[0] >> 0x20;
  return __return_storage_ptr__;
}

Assistant:

SIMD_INLINE c_v256 c_v256_zip_32(c_v128 a, c_v128 b) {
  return c_v256_from_v128(c_v128_ziphi_32(a, b), c_v128_ziplo_32(a, b));
}